

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O2

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* httplib::detail::make_digest_authentication_header
            (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             *__return_storage_ptr__,Request *req,
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *auth,size_t cnonce_count,string *cnonce,string *username,string *password,bool is_proxy
            )

{
  _Rb_tree_header *p_Var1;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar2;
  _Alloc_hider _Var3;
  bool bVar4;
  ostream *poVar5;
  const_iterator cVar6;
  long lVar7;
  mapped_type *pmVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this;
  code *pcVar9;
  undefined1 local_538 [8];
  stringstream ss;
  undefined1 local_528 [376];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_3b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_390;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_370;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_350;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_330;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_310;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2f0;
  undefined1 local_2d0 [8];
  string nc;
  undefined1 local_290 [8];
  string response;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_250;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_230;
  key_type local_210;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *local_1d0;
  undefined1 local_1c8 [8];
  string algo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  string *local_108;
  string *local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  undefined1 local_d8 [8];
  string qop;
  mapped_type opaque;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> field;
  
  local_2d0 = (undefined1  [8])&nc._M_string_length;
  nc._M_dataplus._M_p = (pointer)0x0;
  nc._M_string_length._0_1_ = 0;
  local_108 = username;
  local_100 = cnonce;
  std::__cxx11::stringstream::stringstream((stringstream *)local_538);
  poVar5 = std::operator<<(local_528,0x30);
  lVar7 = *(long *)poVar5;
  *(undefined8 *)(poVar5 + *(long *)(lVar7 + -0x18) + 0x10) = 8;
  lVar7 = *(long *)(lVar7 + -0x18);
  *(uint *)(poVar5 + lVar7 + 0x18) = *(uint *)(poVar5 + lVar7 + 0x18) & 0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)poVar5);
  std::__cxx11::stringbuf::str();
  std::__cxx11::string::operator=((string *)local_2d0,(string *)local_d8);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::stringstream::~stringstream((stringstream *)local_538);
  local_d8 = (undefined1  [8])&qop._M_string_length;
  qop._M_dataplus._M_p = (pointer)0x0;
  qop._M_string_length._0_1_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_538,"qop",(allocator<char> *)local_1c8);
  local_1d0 = __return_storage_ptr__;
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&auth->_M_t,(key_type *)local_538);
  p_Var1 = &(auth->_M_t)._M_impl.super__Rb_tree_header;
  std::__cxx11::string::~string((string *)local_538);
  if ((_Rb_tree_header *)cVar6._M_node != p_Var1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_538,"qop",(allocator<char> *)local_1c8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::at(auth,(key_type *)local_538);
    std::__cxx11::string::_M_assign((string *)local_d8);
    std::__cxx11::string::~string((string *)local_538);
    lVar7 = std::__cxx11::string::find(local_d8,0x1c5e57);
    if (lVar7 == -1) {
      lVar7 = std::__cxx11::string::find(local_d8,0x1c5e60);
      if (lVar7 == -1) {
        qop._M_dataplus._M_p = (pointer)0x0;
        *(char *)local_d8 = '\0';
        goto LAB_0018dfd9;
      }
    }
    std::__cxx11::string::assign(local_d8);
  }
LAB_0018dfd9:
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_1c8,"MD5",(allocator<char> *)local_538);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_538,"algorithm",(allocator<char> *)local_290);
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&auth->_M_t,(key_type *)local_538);
  std::__cxx11::string::~string((string *)local_538);
  if ((_Rb_tree_header *)cVar6._M_node != p_Var1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_538,"algorithm",(allocator<char> *)local_290);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::at(auth,(key_type *)local_538);
    std::__cxx11::string::_M_assign((string *)local_1c8);
    std::__cxx11::string::~string((string *)local_538);
  }
  local_290 = (undefined1  [8])&response._M_string_length;
  response._M_dataplus._M_p = (pointer)0x0;
  response._M_string_length._0_1_ = 0;
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_1c8,"SHA-256");
  if (bVar4) {
    pcVar9 = SHA_256;
  }
  else {
    bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_1c8,"SHA-512");
    pcVar9 = MD5;
    if (bVar4) {
      pcVar9 = SHA_512;
    }
  }
  std::operator+(&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108,":")
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(opaque.field_2._M_local_buf + 8),"realm",(allocator<char> *)&local_f8);
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(auth,(key_type *)((long)&opaque.field_2 + 8));
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 &local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pmVar8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&qop.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,":");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_538,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&qop.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)password);
  std::__cxx11::string::~string((string *)(qop.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(opaque.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_78);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)req,":");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&qop.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&req->path);
  std::__cxx11::string::~string((string *)local_58);
  bVar4 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          local_d8,"auth-int");
  if (bVar4) {
    (*pcVar9)(&local_78,&req->body);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,":"
                   ,&local_78);
    std::__cxx11::string::append((string *)(qop.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)&local_78);
  }
  if (qop._M_dataplus._M_p == (pointer)0x0) {
    (*pcVar9)(&local_168,local_538);
    std::operator+(&local_188,&local_168,":");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"nonce",(allocator<char> *)(algo.field_2._M_local_buf + 8));
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(auth,(key_type *)&local_148);
    std::operator+(&local_f8,&local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pmVar8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&opaque.field_2 + 8),&local_f8,":");
    (*pcVar9)(&local_128,(undefined1 *)((long)&qop.field_2 + 8));
    std::operator+(&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&opaque.field_2 + 8),&local_128);
    (*pcVar9)(local_58,&local_78);
    std::__cxx11::string::operator=((string *)local_290,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)(opaque.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_188);
    this = &local_168;
  }
  else {
    (*pcVar9)(&local_230,local_538);
    std::operator+(&local_250,&local_230,":");
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_210,"nonce",(allocator<char> *)(nc.field_2._M_local_buf + 8));
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(auth,&local_210);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&response.field_2 + 8),&local_250,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pmVar8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&algo.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&response.field_2 + 8),":");
    std::operator+(&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&algo.field_2 + 8),
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
    std::operator+(&local_148,&local_128,":");
    std::operator+(&local_168,&local_148,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
    std::operator+(&local_188,&local_168,":");
    std::operator+(&local_f8,&local_188,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&opaque.field_2 + 8),&local_f8,":");
    (*pcVar9)(&local_1f0,(undefined1 *)((long)&qop.field_2 + 8));
    std::operator+(&local_78,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&opaque.field_2 + 8),&local_1f0);
    (*pcVar9)(local_58,&local_78);
    std::__cxx11::string::operator=((string *)local_290,(string *)local_58);
    std::__cxx11::string::~string((string *)local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_1f0);
    std::__cxx11::string::~string((string *)(opaque.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_f8);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)(algo.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)(response.field_2._M_local_buf + 8));
    std::__cxx11::string::~string((string *)&local_210);
    std::__cxx11::string::~string((string *)&local_250);
    this = &local_230;
  }
  std::__cxx11::string::~string((string *)this);
  std::__cxx11::string::~string((string *)(qop.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_538);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_538,"opaque",(allocator<char> *)&local_78);
  cVar6 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&auth->_M_t,(key_type *)local_538);
  if ((_Rb_tree_header *)cVar6._M_node == p_Var1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(qop.field_2._M_local_buf + 8),"",(allocator<char> *)local_58);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_58,"opaque",(allocator<char> *)(opaque.field_2._M_local_buf + 8));
    pmVar8 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at(auth,(key_type *)local_58);
    std::__cxx11::string::string((string *)(qop.field_2._M_local_buf + 8),(string *)pmVar8);
    std::__cxx11::string::~string((string *)local_58);
  }
  std::__cxx11::string::~string((string *)local_538);
  std::operator+(&local_230,"Digest username=\"",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_108);
  std::operator+(&local_250,&local_230,"\", realm=\"");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_210,"realm",(allocator<char> *)(field.field_2._M_local_buf + 0xe));
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(auth,&local_210);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&response.field_2 + 8),&local_250,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pmVar8);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&algo.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&response.field_2 + 8),"\", nonce=\"");
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f0,"nonce",(allocator<char> *)(field.field_2._M_local_buf + 0xf));
  pmVar8 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::at(auth,(key_type *)&local_1f0);
  std::operator+(&local_128,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&algo.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pmVar8);
  std::operator+(&local_148,&local_128,"\", uri=\"");
  std::operator+(&local_168,&local_148,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&req->path);
  std::operator+(&local_188,&local_168,"\", algorithm=");
  std::operator+(&local_f8,&local_188,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1c8);
  _Var3 = qop._M_dataplus;
  if (qop._M_dataplus._M_p == (pointer)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)(nc.field_2._M_local_buf + 8),", response=\"",(allocator<char> *)&local_330
              );
  }
  else {
    std::operator+(&local_350,", qop=",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d8);
    std::operator+(&local_370,&local_350,", nc=");
    std::operator+(&local_390,&local_370,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0);
    std::operator+(&local_3b0,&local_390,", cnonce=\"");
    std::operator+(&local_330,&local_3b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&nc.field_2 + 8),&local_330,"\", response=\"");
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&opaque.field_2 + 8),&local_f8,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&nc.field_2 + 8));
  std::operator+(&local_78,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&opaque.field_2 + 8),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_290);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_538,
                 &local_78,"\"");
  if (opaque._M_dataplus._M_p == (pointer)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_310,"",(allocator<char> *)&local_2f0);
  }
  else {
    std::operator+(&local_2f0,", opaque=\"",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&qop.field_2 + 8));
    std::operator+(&local_310,&local_2f0,"\"");
  }
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_538,
                 &local_310);
  std::__cxx11::string::~string((string *)&local_310);
  if (opaque._M_dataplus._M_p != (pointer)0x0) {
    std::__cxx11::string::~string((string *)&local_2f0);
  }
  std::__cxx11::string::~string((string *)local_538);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)(opaque.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(nc.field_2._M_local_buf + 8));
  if (_Var3._M_p != (pointer)0x0) {
    std::__cxx11::string::~string((string *)&local_330);
    std::__cxx11::string::~string((string *)&local_3b0);
    std::__cxx11::string::~string((string *)&local_390);
    std::__cxx11::string::~string((string *)&local_370);
    std::__cxx11::string::~string((string *)&local_350);
  }
  std::__cxx11::string::~string((string *)&local_f8);
  std::__cxx11::string::~string((string *)&local_188);
  std::__cxx11::string::~string((string *)&local_168);
  std::__cxx11::string::~string((string *)&local_148);
  std::__cxx11::string::~string((string *)&local_128);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::string::~string((string *)(algo.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)(response.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_250);
  std::__cxx11::string::~string((string *)&local_230);
  local_538 = (undefined1  [8])0x1c5cfc;
  if (is_proxy) {
    local_538 = (undefined1  [8])0x1c5cf6;
  }
  std::__cxx11::string::string((string *)&ss,(string *)local_58);
  ppVar2 = local_1d0;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (local_1d0,
             (pair<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_538);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(qop.field_2._M_local_buf + 8));
  std::__cxx11::string::~string((string *)local_290);
  std::__cxx11::string::~string((string *)local_1c8);
  std::__cxx11::string::~string((string *)local_d8);
  std::__cxx11::string::~string((string *)local_2d0);
  return ppVar2;
}

Assistant:

inline std::pair<std::string, std::string> make_digest_authentication_header(
            const Request& req, const std::map<std::string, std::string>& auth,
            size_t cnonce_count, const std::string& cnonce, const std::string& username,
            const std::string& password, bool is_proxy = false) {
            std::string nc;
            {
                std::stringstream ss;
                ss << std::setfill('0') << std::setw(8) << std::hex << cnonce_count;
                nc = ss.str();
            }

            std::string qop;
            if (auth.find("qop") != auth.end()) {
                qop = auth.at("qop");
                if (qop.find("auth-int") != std::string::npos) {
                    qop = "auth-int";
                } else if (qop.find("auth") != std::string::npos) {
                    qop = "auth";
                } else {
                    qop.clear();
                }
            }

            std::string algo = "MD5";
            if (auth.find("algorithm") != auth.end()) { algo = auth.at("algorithm"); }

            std::string response;
            {
                auto H = algo == "SHA-256" ? detail::SHA_256
                    : algo == "SHA-512" ? detail::SHA_512
                    : detail::MD5;

                auto A1 = username + ":" + auth.at("realm") + ":" + password;

                auto A2 = req.method + ":" + req.path;
                if (qop == "auth-int") { A2 += ":" + H(req.body); }

                if (qop.empty()) {
                    response = H(H(A1) + ":" + auth.at("nonce") + ":" + H(A2));
                } else {
                    response = H(H(A1) + ":" + auth.at("nonce") + ":" + nc + ":" + cnonce +
                        ":" + qop + ":" + H(A2));
                }
            }

            auto opaque = (auth.find("opaque") != auth.end()) ? auth.at("opaque") : "";

            auto field = "Digest username=\"" + username + "\", realm=\"" +
                auth.at("realm") + "\", nonce=\"" + auth.at("nonce") +
                "\", uri=\"" + req.path + "\", algorithm=" + algo +
                (qop.empty() ? ", response=\""
                    : ", qop=" + qop + ", nc=" + nc + ", cnonce=\"" +
                    cnonce + "\", response=\"") +
                response + "\"" +
                (opaque.empty() ? "" : ", opaque=\"" + opaque + "\"");

            auto key = is_proxy ? "Proxy-Authorization" : "Authorization";
            return std::make_pair(key, field);
        }